

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::TestResult::HasNonfatalFailure(TestResult *this)

{
  int iVar1;
  TestResult *this_local;
  
  iVar1 = internal::
          CountIf<std::vector<testing::TestPartResult,std::allocator<testing::TestPartResult>>,bool(*)(testing::TestPartResult_const&)>
                    (&this->test_part_results_,TestPartNonfatallyFailed);
  return 0 < iVar1;
}

Assistant:

bool TestResult::HasNonfatalFailure() const {
  return CountIf(test_part_results_, TestPartNonfatallyFailed) > 0;
}